

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void test_base64_decode(void)

{
  int iVar1;
  ptls_base64_decode_state_t state;
  ptls_buffer_t local_40;
  
  local_40.base = "";
  local_40.capacity = 0;
  local_40.off = 0;
  local_40.is_allocated = 0;
  ptls_base64_decode_init(&state);
  iVar1 = ptls_base64_decode("aGVsbG8gd29ybGQ=",&state,&local_40);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x195);
  _ok((uint)(local_40.off == 0xb),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x196);
  iVar1 = bcmp(local_40.base,"hello world",0xb);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x197);
  local_40.off = 0;
  ptls_base64_decode_init(&state);
  iVar1 = ptls_base64_decode("a$b",&state,&local_40);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x19d);
  local_40.off = 0;
  ptls_base64_decode_init(&state);
  iVar1 = ptls_base64_decode(anon_var_dwarf_dfce,&state,&local_40);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1a5);
  ptls_buffer_dispose(&local_40);
  return;
}

Assistant:

static void test_base64_decode(void)
{
    ptls_base64_decode_state_t state;
    ptls_buffer_t buf;
    int ret;

    ptls_buffer_init(&buf, "", 0);

    ptls_base64_decode_init(&state);
    ret = ptls_base64_decode("aGVsbG8gd29ybGQ=", &state, &buf);
    ok(ret == 0);
    ok(buf.off == 11);
    ok(memcmp(buf.base, "hello world", 11) == 0);

    buf.off = 0;

    ptls_base64_decode_init(&state);
    ret = ptls_base64_decode("a$b", &state, &buf);
    ok(ret != 0);

    buf.off = 0;

    ptls_base64_decode_init(&state);
    ret = ptls_base64_decode("a\xFF"
                             "b",
                             &state, &buf);
    ok(ret != 0);

    ptls_buffer_dispose(&buf);
}